

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O1

_Bool ssh2_common_filter_queue(PacketProtocolLayer *ppl)

{
  PktInQueue *pPVar1;
  LogContext *ctx;
  Ssh *ssh;
  BinarySource *src;
  _Bool _Var2;
  uint uVar3;
  PktIn *pPVar4;
  char *pcVar5;
  unsigned_long uVar6;
  int iVar7;
  ptrlen pVar8;
  ptrlen algname;
  ptrlen extvalue;
  ptrlen local_68;
  PktIn *local_58;
  unsigned_long local_50;
  BinarySource *local_48;
  ptrlen local_40;
  
  pPVar1 = ppl->in_pq;
  pPVar4 = (*pPVar1->after)(&pPVar1->pqb,(PacketQueueNode *)pPVar1,false);
  if (pPVar4 != (PktIn *)0x0) {
    do {
      switch(pPVar4->type) {
      case 1:
        uVar6 = BinarySource_get_uint32(pPVar4->binarysource_);
        pVar8 = BinarySource_get_string(pPVar4->binarysource_);
        ssh = ppl->ssh;
        iVar7 = (int)uVar6;
        if ((ulong)(long)iVar7 < 0x10 && 0 < iVar7) {
          pcVar5 = ssh2_common_filter_queue::ssh2_disconnect_reasons[iVar7];
        }
        else {
          pcVar5 = "unknown";
        }
        uVar3 = string_length_for_printf(pVar8.len);
        ssh_remote_error(ssh,"Remote side sent disconnect message\ntype %d (%s):\n\"%.*s\"",
                         uVar6 & 0xffffffff,pcVar5,(ulong)uVar3,pVar8.ptr);
        return true;
      case 2:
        break;
      default:
        goto switchD_0012bbcc_caseD_3;
      case 4:
        BinarySource_get_bool(pPVar4->binarysource_);
        pVar8 = BinarySource_get_string(pPVar4->binarysource_);
        ctx = ppl->logctx;
        uVar3 = string_length_for_printf(pVar8.len);
        pcVar5 = dupprintf("Remote debug message: %.*s",(ulong)uVar3,pVar8.ptr);
        logevent_and_free(ctx,pcVar5);
        break;
      case 7:
        local_48 = pPVar4->binarysource_;
        local_50 = BinarySource_get_uint32(local_48);
        if ((int)local_50 != 0) {
          iVar7 = 0;
          local_58 = pPVar4;
          do {
            src = local_48;
            if (local_58->binarysource_[0].err != BSE_NO_ERROR) break;
            pVar8 = BinarySource_get_string(local_48);
            local_40 = BinarySource_get_string(src);
            _Var2 = ptrlen_eq_string(pVar8,"server-sig-algs");
            if ((_Var2) && (_Var2 = get_commasep_word(&local_40,&local_68), _Var2)) {
              do {
                _Var2 = ptrlen_eq_string(local_68,"rsa-sha2-256");
                if (_Var2) {
                  ppl->bpp->ext_info_rsa_sha256_ok = true;
                }
                _Var2 = ptrlen_eq_string(local_68,"rsa-sha2-512");
                if (_Var2) {
                  ppl->bpp->ext_info_rsa_sha512_ok = true;
                }
                _Var2 = get_commasep_word(&local_40,&local_68);
              } while (_Var2);
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != (int)local_50);
        }
      }
      pPVar1 = ppl->in_pq;
      (*pPVar1->after)(&pPVar1->pqb,(PacketQueueNode *)pPVar1,true);
      pPVar1 = ppl->in_pq;
      pPVar4 = (*pPVar1->after)(&pPVar1->pqb,(PacketQueueNode *)pPVar1,false);
    } while (pPVar4 != (PktIn *)0x0);
  }
switchD_0012bbcc_caseD_3:
  return false;
}

Assistant:

bool ssh2_common_filter_queue(PacketProtocolLayer *ppl)
{
    static const char *const ssh2_disconnect_reasons[] = {
        NULL,
        "host not allowed to connect",
        "protocol error",
        "key exchange failed",
        "host authentication failed",
        "MAC error",
        "compression error",
        "service not available",
        "protocol version not supported",
        "host key not verifiable",
        "connection lost",
        "by application",
        "too many connections",
        "auth cancelled by user",
        "no more auth methods available",
        "illegal user name",
    };

    PktIn *pktin;
    ptrlen msg;
    int reason;

    while ((pktin = pq_peek(ppl->in_pq)) != NULL) {
        switch (pktin->type) {
          case SSH2_MSG_DISCONNECT:
            reason = get_uint32(pktin);
            msg = get_string(pktin);

            ssh_remote_error(
                ppl->ssh, "Remote side sent disconnect message\n"
                "type %d (%s):\n\"%.*s\"", reason,
                ((reason > 0 && reason < lenof(ssh2_disconnect_reasons)) ?
                 ssh2_disconnect_reasons[reason] : "unknown"),
                PTRLEN_PRINTF(msg));
            /* don't try to pop the queue, because we've been freed! */
            return true;               /* indicate that we've been freed */

          case SSH2_MSG_DEBUG:
            /* XXX maybe we should actually take notice of the return value */
            get_bool(pktin);
            msg = get_string(pktin);
            ppl_logevent("Remote debug message: %.*s", PTRLEN_PRINTF(msg));
            pq_pop(ppl->in_pq);
            break;

          case SSH2_MSG_IGNORE:
            /* Do nothing, because we're ignoring it! Duhh. */
            pq_pop(ppl->in_pq);
            break;

          case SSH2_MSG_EXT_INFO: {
            /*
             * The BPP enforces that these turn up only at legal
             * points in the protocol. In particular, it will not pass
             * an EXT_INFO on to us if it arrives before encryption is
             * enabled (which is when a MITM could inject one
             * maliciously).
             *
             * However, one of the criteria for legality is that a
             * server is permitted to send this message immediately
             * _before_ USERAUTH_SUCCESS. So we may receive this
             * message not yet knowing whether it's legal to have sent
             * it - we won't know until the BPP processes the next
             * packet.
             *
             * But that should be OK, because firstly, an
             * out-of-sequence EXT_INFO that's still within the
             * encrypted session is only a _protocol_ violation, not
             * an attack; secondly, any data we set in response to
             * such an illegal EXT_INFO won't have a chance to affect
             * the session before the BPP aborts it anyway.
             */
            uint32_t nexts = get_uint32(pktin);
            for (uint32_t i = 0; i < nexts && !get_err(pktin); i++) {
                ptrlen extname = get_string(pktin);
                ptrlen extvalue = get_string(pktin);
                if (ptrlen_eq_string(extname, "server-sig-algs")) {
                    /*
                     * Server has sent a list of signature algorithms
                     * it will potentially accept for user
                     * authentication keys. Check in particular
                     * whether the RFC 8332 improved versions of
                     * ssh-rsa are in the list, and set flags in the
                     * BPP if so.
                     *
                     * TODO: another thing we _could_ do here is to
                     * record a full list of the algorithm identifiers
                     * we've seen, whether we understand them
                     * ourselves or not. Then we could use that as a
                     * pre-filter during userauth, to skip keys in the
                     * SSH agent if we already know the server can't
                     * possibly accept them. (Even if the key
                     * algorithm is one that the agent and the server
                     * both understand but we do not.)
                     */
                    ptrlen algname;
                    while (get_commasep_word(&extvalue, &algname)) {
                        if (ptrlen_eq_string(algname, "rsa-sha2-256"))
                            ppl->bpp->ext_info_rsa_sha256_ok = true;
                        if (ptrlen_eq_string(algname, "rsa-sha2-512"))
                            ppl->bpp->ext_info_rsa_sha512_ok = true;
                    }
                }
            }
            pq_pop(ppl->in_pq);
            break;
          }

          default:
            return false;
        }
    }

    return false;
}